

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

uint64_t __thiscall cmLocalGenerator::GetBackwardsCompatibility(cmLocalGenerator *this)

{
  cmMakefile *this_00;
  int iVar1;
  char *pcVar2;
  uint patch;
  uint minor;
  uint major;
  uint local_54;
  uint local_50;
  int local_4c;
  string local_48;
  
  if (this->BackwardsCompatibilityFinal == false) {
    local_4c = 0;
    local_50 = 0;
    local_54 = 0;
    this_00 = this->Makefile;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"CMAKE_BACKWARDS_COMPATIBILITY","");
    pcVar2 = cmMakefile::GetDefinition(this_00,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (pcVar2 != (char *)0x0) {
      iVar1 = __isoc99_sscanf(pcVar2,"%u.%u.%u",&local_4c,&local_50,&local_54);
      if (iVar1 == 1) {
        local_50 = 0;
        local_54 = 0;
      }
      else if (iVar1 == 2) {
        local_54 = 0;
      }
    }
    this->BackwardsCompatibility =
         (ulong)(local_54 % 100000000) +
         ((ulong)(local_50 % 1000) + (ulong)(uint)(local_4c * 1000)) * 100000000;
    this->BackwardsCompatibilityFinal = true;
  }
  return this->BackwardsCompatibility;
}

Assistant:

KWIML_INT_uint64_t cmLocalGenerator::GetBackwardsCompatibility()
{
  // The computed version may change until the project is fully
  // configured.
  if(!this->BackwardsCompatibilityFinal)
    {
    unsigned int major = 0;
    unsigned int minor = 0;
    unsigned int patch = 0;
    if(const char* value
       = this->Makefile->GetDefinition("CMAKE_BACKWARDS_COMPATIBILITY"))
      {
      switch(sscanf(value, "%u.%u.%u", &major, &minor, &patch))
        {
        case 2: patch = 0; break;
        case 1: minor = 0; patch = 0; break;
        default: break;
        }
      }
    this->BackwardsCompatibility = CMake_VERSION_ENCODE(major, minor, patch);
    this->BackwardsCompatibilityFinal = true;
    }

  return this->BackwardsCompatibility;
}